

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_lexer.yy.cc
# Opt level: O2

void __thiscall yyFlexLexer::yyunput(yyFlexLexer *this,int c,char *yy_bp)

{
  char *pcVar1;
  yy_buffer_state *pyVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  
  pcVar8 = this->yy_c_buf_p;
  *pcVar8 = this->yy_hold_char;
  pyVar2 = this->yy_buffer_stack[this->yy_buffer_stack_top];
  pcVar1 = pyVar2->yy_ch_buf;
  if (pcVar8 < pcVar1 + 2) {
    pcVar3 = pcVar1 + (long)this->yy_n_chars + 2;
    pcVar5 = pcVar1 + (long)pyVar2->yy_buf_size + 2;
    pcVar6 = pcVar1 + (long)pyVar2->yy_buf_size + 1;
    pcVar7 = pcVar3;
    while (pcVar1 < pcVar7) {
      pcVar1 = pcVar7 + -1;
      pcVar7 = pcVar7 + -1;
      *pcVar6 = *pcVar1;
      pyVar2 = this->yy_buffer_stack[this->yy_buffer_stack_top];
      pcVar5 = pcVar5 + -1;
      pcVar6 = pcVar6 + -1;
      pcVar3 = pcVar3 + -1;
      pcVar1 = pyVar2->yy_ch_buf;
    }
    iVar4 = (int)pcVar5 - (int)pcVar3;
    pcVar8 = pcVar8 + iVar4;
    yy_bp = yy_bp + iVar4;
    iVar4 = pyVar2->yy_buf_size;
    this->yy_n_chars = iVar4;
    pyVar2->yy_n_chars = iVar4;
    if (pcVar8 < pcVar1 + 2) {
      (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])(this,"flex scanner push-back overflow");
    }
  }
  pcVar8[-1] = (char)c;
  (this->super_FlexLexer).yytext = yy_bp;
  this->yy_hold_char = pcVar8[-1];
  this->yy_c_buf_p = pcVar8 + -1;
  return;
}

Assistant:

void yyFlexLexer::yyunput( int c, char* yy_bp)
/* %endif */
{
	char *yy_cp;
    
    yy_cp = (yy_c_buf_p);

	/* undo effects of setting up yytext */
	*yy_cp = (yy_hold_char);

	if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
		{ /* need to shift things up to make room */
		/* +2 for EOB chars. */
		int number_to_move = (yy_n_chars) + 2;
		char *dest = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[
					YY_CURRENT_BUFFER_LVALUE->yy_buf_size + 2];
		char *source =
				&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move];

		while ( source > YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			*--dest = *--source;

		yy_cp += (int) (dest - source);
		yy_bp += (int) (dest - source);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars =
			(yy_n_chars) = (int) YY_CURRENT_BUFFER_LVALUE->yy_buf_size;

		if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
			YY_FATAL_ERROR( "flex scanner push-back overflow" );
		}

	*--yy_cp = (char) c;

/* %% [18.0] update yylineno here */

	(yytext_ptr) = yy_bp;
	(yy_hold_char) = *yy_cp;
	(yy_c_buf_p) = yy_cp;
}